

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O0

void __thiscall
o3dgc::Arithmetic_Codec::set_buffer(Arithmetic_Codec *this,uint max_code_bytes,uchar *user_buffer)

{
  uchar *puVar1;
  uchar *user_buffer_local;
  uint max_code_bytes_local;
  Arithmetic_Codec *this_local;
  
  if (max_code_bytes == 0) {
    AC_Error("invalid codec buffer size");
  }
  if (this->mode != 0) {
    AC_Error("cannot set buffer while encoding or decoding");
  }
  if (user_buffer == (uchar *)0x0) {
    if (this->buffer_size < max_code_bytes) {
      this->buffer_size = max_code_bytes;
      if (this->new_buffer != (uchar *)0x0) {
        operator_delete__(this->new_buffer);
      }
      puVar1 = (uchar *)operator_new__((ulong)(this->buffer_size + 0x10));
      this->new_buffer = puVar1;
      if (puVar1 == (uchar *)0x0) {
        AC_Error("cannot assign memory for compressed data buffer");
      }
      this->code_buffer = this->new_buffer;
    }
  }
  else {
    this->buffer_size = max_code_bytes;
    this->code_buffer = user_buffer;
    if (this->new_buffer != (uchar *)0x0) {
      operator_delete__(this->new_buffer);
    }
    this->new_buffer = (uchar *)0x0;
  }
  return;
}

Assistant:

void Arithmetic_Codec::set_buffer(unsigned max_code_bytes,
                                      unsigned char * user_buffer)
    {
                                                      // test for reasonable sizes
      if (!max_code_bytes)// || (max_code_bytes > 0x10000000U)) // updated by K. Mammou
      {
        AC_Error("invalid codec buffer size");
      }
      if (mode != 0) AC_Error("cannot set buffer while encoding or decoding");

      if (user_buffer != 0) {                       // user provides memory buffer
        buffer_size = max_code_bytes;
        code_buffer = user_buffer;               // set buffer for compressed data
        delete [] new_buffer;                 // free anything previously assigned
        new_buffer = 0;
        return;
      }

      if (max_code_bytes <= buffer_size) return;               // enough available

      buffer_size = max_code_bytes;                           // assign new memory
      delete [] new_buffer;                   // free anything previously assigned
      if ((new_buffer = new unsigned char[buffer_size+16]) == 0) // 16 extra bytes
        AC_Error("cannot assign memory for compressed data buffer");
      code_buffer = new_buffer;                  // set buffer for compressed data
    }